

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::DeviceContextVkImpl::EndQuery(DeviceContextVkImpl *this,IQuery *pQuery)

{
  uint uVar1;
  VkQueryPool queryPool;
  Uint32 query;
  char (*Args_1) [32];
  uint queryFlag;
  ulong uVar2;
  string msg;
  string local_48;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::EndQuery
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pQuery,0);
  if ((this->m_pQueryMgr == (QueryManagerVk *)0x0) &&
     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false)) {
    FormatString<char[80]>
              (&local_48,
               (char (*) [80])
               "Query manager should never be null for immediate contexts. This might be a bug.");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb77);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_pQueryMgr == (QueryManagerVk *)0x0) {
    FormatString<char[94]>
              (&local_48,
               (char (*) [94])
               "Query manager is null, which indicates that this deferred context is not in a recording state"
              );
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (pQuery != (IQuery *)0x0) {
    CheckDynamicType<Diligent::QueryVkImpl,Diligent::IQuery>(pQuery);
  }
  uVar1 = *(uint *)&pQuery[4].super_IDeviceObject.super_IObject._vptr_IObject;
  uVar2 = (ulong)uVar1;
  Args_1 = (char (*) [32])(uVar2 * 0x80);
  queryPool = (this->m_pQueryMgr->m_Pools)._M_elems[uVar2].m_vkQueryPool.m_VkObject;
  query = QueryVkImpl::GetQueryPoolIndex((QueryVkImpl *)pQuery,(uint)(uVar2 == 5));
  if (queryPool == (VkQueryPool)0x0) {
    FormatString<char[45]>(&local_48,(char (*) [45])"Query pool is not initialized for query type");
    Args_1 = (char (*) [32])0xb7f;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"EndQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb7f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureVkCmdBuffer(this);
  if ((uVar1 == 5) || (uVar1 == 3)) {
    if ((this->m_CommandBuffer).m_VkCmdBuffer == (VkCommandBuffer)0x0) {
      FormatString<char[26],char[32]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"WriteTimestamp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
                 ,0x27e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    (*vkCmdWriteTimestamp)
              ((this->m_CommandBuffer).m_VkCmdBuffer,VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT,queryPool,
               query);
  }
  else {
    if (this->m_ActiveQueriesCounter < 1) {
      FormatString<char[99]>
                (&local_48,
                 (char (*) [99])
                 "Active query counter is 0 which means there was a mismatch between BeginQuery() / EndQuery() calls"
                );
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    queryFlag = 1 << ((byte)uVar1 & 0x1f);
    if ((((this->m_CommandBuffer).m_State.OutsidePassQueries |
         (this->m_CommandBuffer).m_State.InsidePassQueries) >> (uVar1 & 0x1f) & 1) == 0) {
      FormatString<char[124]>
                (&local_48,
                 (char (*) [124])
                 "No query flag is set which indicates there was no matching BeginQuery call or there was an error while beginning the query."
                );
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"EndQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xb8e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    if (((this->m_CommandBuffer).m_State.OutsidePassQueries & queryFlag) == 0) {
      if ((this->m_CommandBuffer).m_State.RenderPass == (VkRenderPass)0x0) {
        FormatString<char[297]>
                  (&local_48,
                   (char (*) [297])
                   "The query was started inside render pass, but is being ended outside of render pass. Vulkan requires that a query must either begin and end inside the same subpass of a render pass instance, or must both begin and end outside of a render pass instance (i.e. contain entire render pass instances)."
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      EndRenderScope(this);
    }
    this->m_ActiveQueriesCounter = this->m_ActiveQueriesCounter + -1;
    VulkanUtilities::VulkanCommandBuffer::EndQuery(&this->m_CommandBuffer,queryPool,query,queryFlag)
    ;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::EndQuery(IQuery* pQuery)
{
    TDeviceContextBase::EndQuery(pQuery, 0);

    VERIFY(m_pQueryMgr != nullptr || IsDeferred(), "Query manager should never be null for immediate contexts. This might be a bug.");
    DEV_CHECK_ERR(m_pQueryMgr != nullptr, "Query manager is null, which indicates that this deferred context is not in a recording state");

    QueryVkImpl*     pQueryVkImpl = ClassPtrCast<QueryVkImpl>(pQuery);
    const QUERY_TYPE QueryType    = pQueryVkImpl->GetDesc().Type;
    VkQueryPool      vkQueryPool  = m_pQueryMgr->GetQueryPool(QueryType);
    Uint32           Idx          = pQueryVkImpl->GetQueryPoolIndex(QueryType == QUERY_TYPE_DURATION ? 1 : 0);

    VERIFY(vkQueryPool != VK_NULL_HANDLE, "Query pool is not initialized for query type");

    EnsureVkCmdBuffer();
    if (QueryType == QUERY_TYPE_TIMESTAMP || QueryType == QUERY_TYPE_DURATION)
    {
        m_CommandBuffer.WriteTimestamp(VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, vkQueryPool, Idx);
    }
    else
    {
        VERIFY(m_ActiveQueriesCounter > 0, "Active query counter is 0 which means there was a mismatch between BeginQuery() / EndQuery() calls");

        // A query must either begin and end inside the same subpass of a render pass instance, or must
        // both begin and end outside of a render pass instance (i.e. contain entire render pass instances).
        const VulkanUtilities::VulkanCommandBuffer::StateCache& CmdBuffState = m_CommandBuffer.GetState();
        VERIFY((CmdBuffState.InsidePassQueries | CmdBuffState.OutsidePassQueries) & (1u << QueryType),
               "No query flag is set which indicates there was no matching BeginQuery call or there was an error while beginning the query.");
        if (CmdBuffState.OutsidePassQueries & (1 << QueryType))
        {
            EndRenderScope();
        }
        else
        {
            if (!m_CommandBuffer.GetState().RenderPass)
                LOG_ERROR_MESSAGE("The query was started inside render pass, but is being ended outside of render pass. "
                                  "Vulkan requires that a query must either begin and end inside the same "
                                  "subpass of a render pass instance, or must both begin and end outside of a render pass "
                                  "instance (i.e. contain entire render pass instances).");
        }

        --m_ActiveQueriesCounter;
        m_CommandBuffer.EndQuery(vkQueryPool, Idx, 1u << QueryType);
    }
}